

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ribbon_artist.cpp
# Opt level: O2

void __thiscall polyscope::RibbonArtist::draw(RibbonArtist *this)

{
  element_type *peVar1;
  ShaderProgram *p;
  allocator local_51;
  string local_50 [32];
  string local_30 [32];
  
  if ((this->enabled).value == true) {
    p = (this->program).
        super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (p == (ShaderProgram *)0x0) {
      createProgram(this);
      p = (this->program).
          super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    Structure::setTransformUniforms(this->parentStructure,p);
    view::getCameraWorldPosition();
    peVar1 = (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_30,"u_ribbonWidth",&local_51);
    getWidth(this);
    (*peVar1->_vptr_ShaderProgram[6])(peVar1,local_30);
    std::__cxx11::string::~string(local_30);
    peVar1 = (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__cxx11::string::string(local_50,"u_depthOffset",&local_51);
    (*peVar1->_vptr_ShaderProgram[6])(0x3f1a36e2eb1c432d,peVar1,local_50);
    std::__cxx11::string::~string(local_50);
    (**(code **)(*render::engine + 0x50))(render::engine,2);
    (**(code **)(*render::engine + 0x58))(render::engine,0);
    (*((this->program).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x1e])();
    (**(code **)(*render::engine + 0x50))(render::engine,0);
    (**(code **)(*render::engine + 0x58))(render::engine,0);
  }
  return;
}

Assistant:

void RibbonArtist::draw() {

  if (!enabled.get()) {
    return;
  }

  if (!program) {
    createProgram();
  }

  // Set uniforms
  parentStructure.setTransformUniforms(*program);

  glm::vec3 eyePos = view::getCameraWorldPosition();

  program->setUniform("u_ribbonWidth", getWidth());
  program->setUniform("u_depthOffset", 1e-4);

  // Draw
  render::engine->setDepthMode(DepthMode::LEqualReadOnly);
  render::engine->setBlendMode(BlendMode::Over);

  program->draw();

  render::engine->setDepthMode();
  render::engine->setBlendMode();
}